

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

void deqp::gls::calcShaderColorCoord<int>
               (Vec2 *coord,Vec3 *color,Vector<int,_4> *attribValue,bool isCoordinate,
               int numComponents)

{
  int iVar1;
  undefined7 in_register_00000009;
  float fVar2;
  undefined8 local_1c;
  float local_14;
  
  if ((int)CONCAT71(in_register_00000009,isCoordinate) != 0) {
    switch(numComponents + -1) {
    case 0:
      iVar1 = attribValue->m_data[0];
      coord->m_data[0] = (float)iVar1;
      coord->m_data[1] = (float)iVar1;
      break;
    case 1:
      *(ulong *)coord->m_data =
           CONCAT44((float)(int)((ulong)*(undefined8 *)attribValue->m_data >> 0x20),
                    (float)(int)*(undefined8 *)attribValue->m_data);
      return;
    case 2:
      iVar1 = attribValue->m_data[1];
      coord->m_data[0] = (float)attribValue->m_data[2] + (float)attribValue->m_data[0];
      coord->m_data[1] = (float)iVar1;
      return;
    case 3:
      *(ulong *)coord->m_data =
           CONCAT44((float)(int)((ulong)*(undefined8 *)(attribValue->m_data + 2) >> 0x20) +
                    (float)(int)((ulong)*(undefined8 *)attribValue->m_data >> 0x20),
                    (float)(int)*(undefined8 *)(attribValue->m_data + 2) +
                    (float)(int)*(undefined8 *)attribValue->m_data);
      return;
    }
switchD_014eeb6b_default:
    return;
  }
  switch(numComponents + -1) {
  case 0:
    tcu::operator*((tcu *)&local_1c,(float)attribValue->m_data[0],color);
    color->m_data[2] = local_14;
    *(undefined8 *)color->m_data = local_1c;
    break;
  case 1:
    *(ulong *)color->m_data =
         CONCAT44((float)(int)((ulong)*(undefined8 *)attribValue->m_data >> 0x20) *
                  (float)((ulong)*(undefined8 *)color->m_data >> 0x20),
                  (float)(int)*(undefined8 *)attribValue->m_data *
                  (float)*(undefined8 *)color->m_data);
    break;
  case 2:
    *(ulong *)color->m_data =
         CONCAT44((float)(int)((ulong)*(undefined8 *)attribValue->m_data >> 0x20) *
                  (float)((ulong)*(undefined8 *)color->m_data >> 0x20),
                  (float)(int)*(undefined8 *)attribValue->m_data *
                  (float)*(undefined8 *)color->m_data);
    color->m_data[2] = (float)attribValue->m_data[2] * color->m_data[2];
    break;
  case 3:
    fVar2 = (float)attribValue->m_data[3];
    *(ulong *)color->m_data =
         CONCAT44(fVar2 * (float)(int)((ulong)*(undefined8 *)attribValue->m_data >> 0x20) *
                          (float)((ulong)*(undefined8 *)color->m_data >> 0x20),
                  fVar2 * (float)(int)*(undefined8 *)attribValue->m_data *
                          (float)*(undefined8 *)color->m_data);
    color->m_data[2] = (float)attribValue->m_data[2] * color->m_data[2] * fVar2;
    break;
  default:
    goto switchD_014eeb6b_default;
  }
  return;
}

Assistant:

void calcShaderColorCoord (tcu::Vec2& coord, tcu::Vec3& color, const tcu::Vector<T, 4>& attribValue, bool isCoordinate, int numComponents)
{
	if (isCoordinate)
		switch (numComponents)
		{
			case 1:	coord = tcu::Vec2((float)attribValue.x(),							(float)attribValue.x());							break;
			case 2:	coord = tcu::Vec2((float)attribValue.x(),							(float)attribValue.y());							break;
			case 3:	coord = tcu::Vec2((float)attribValue.x() + (float)attribValue.z(),	(float)attribValue.y());							break;
			case 4:	coord = tcu::Vec2((float)attribValue.x() + (float)attribValue.z(),	(float)attribValue.y() + (float)attribValue.w());	break;

			default:
				DE_ASSERT(false);
		}
	else
	{
		switch (numComponents)
		{
			case 1:
				color = color * (float)attribValue.x();
				break;

			case 2:
				color.x() = color.x() * (float)attribValue.x();
				color.y() = color.y() * (float)attribValue.y();
				break;

			case 3:
				color.x() = color.x() * (float)attribValue.x();
				color.y() = color.y() * (float)attribValue.y();
				color.z() = color.z() * (float)attribValue.z();
				break;

			case 4:
				color.x() = color.x() * (float)attribValue.x() * (float)attribValue.w();
				color.y() = color.y() * (float)attribValue.y() * (float)attribValue.w();
				color.z() = color.z() * (float)attribValue.z() * (float)attribValue.w();
				break;

			default:
				DE_ASSERT(false);
		}
	}
}